

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O2

DecoratorDataHandle __thiscall
Rml::DecoratorNinePatch::GenerateElementData
          (DecoratorNinePatch *this,Element *element,BoxArea paint_area)

{
  float *pfVar1;
  Vector2Type VVar2;
  Vector2Type VVar3;
  undefined4 uVar4;
  int iVar5;
  array<Rml::NumericValue,_4UL> *paVar6;
  int y;
  Colour<unsigned_char,_255,_true> CVar7;
  ComputedValues *pCVar8;
  long lVar9;
  pointer piVar10;
  RenderManager *this_00;
  RenderManager *mesh_00;
  long lVar11;
  long lVar12;
  int i;
  long lVar13;
  float fVar14;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined1 auVar15 [16];
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar16 [16];
  float fVar17;
  float base_value;
  float fVar18;
  float fVar19;
  undefined8 local_188;
  Vector2<float> VStack_180;
  Vector2<float> local_178;
  float fStack_170;
  float fStack_16c;
  Vector2Type local_168;
  undefined8 uStack_160;
  Vector2Type local_158;
  undefined8 uStack_150;
  Vector2Type local_148;
  undefined8 uStack_140;
  Vector2f tex_pos [4];
  float local_118;
  float fStack_114;
  float local_108;
  float fStack_104;
  Vector2f surface_center_size;
  Vector2f surface_dimensions;
  Mesh mesh;
  Vector2f tex_coords [4];
  Texture texture;
  RenderBox render_box;
  
  pCVar8 = Element::GetComputedValues(element);
  texture = Decorator::GetTexture(&this->super_Decorator,0);
  local_148 = (Vector2Type)Texture::GetDimensions(&texture);
  uStack_140 = 0;
  Element::GetRenderBox(&render_box,element,paint_area,0);
  surface_dimensions = render_box.fill_size;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,(pCVar8->rare).image_color)
  ;
  CVar7 = Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                    ((Colour<unsigned_char,255,false> *)&mesh,(pCVar8->inherited).opacity);
  local_168 = (this->rect_outer).p0;
  uStack_160 = 0;
  tex_pos[0].x = local_168.x;
  tex_pos[0].y = local_168.y;
  VVar2 = (this->rect_inner).p0;
  tex_pos[1].x = VVar2.x;
  tex_pos[1].y = VVar2.y;
  local_158 = (this->rect_inner).p1;
  uStack_150 = 0;
  tex_pos[2].x = local_158.x;
  tex_pos[2].y = local_158.y;
  VVar3 = (this->rect_outer).p1;
  tex_pos[3].x = VVar3.x;
  tex_pos[3].y = VVar3.y;
  tex_coords[2].x = 0.0;
  tex_coords[2].y = 0.0;
  tex_coords[3].x = 0.0;
  tex_coords[3].y = 0.0;
  tex_coords[0].x = 0.0;
  tex_coords[0].y = 0.0;
  tex_coords[1].x = 0.0;
  tex_coords[1].y = 0.0;
  auVar15._0_4_ = (float)(int)local_148.x;
  auVar15._4_4_ = (float)(int)local_148.y;
  auVar15._8_4_ = (float)(int)(float)uStack_140;
  auVar15._12_4_ = (float)(int)uStack_140._4_4_;
  for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
    auVar16._8_8_ = 0;
    auVar16._0_4_ = tex_pos[lVar13].x;
    auVar16._4_4_ = tex_pos[lVar13].y;
    auVar16 = divps(auVar16,auVar15);
    tex_coords[lVar13] = auVar16._0_8_;
  }
  uStack_140 = 0;
  local_148 = VVar2;
  fVar14 = ElementUtilities::GetDensityIndependentPixelRatio(element);
  fVar14 = fVar14 * this->display_scale;
  fVar17 = (local_148.x - local_168.x) * fVar14;
  base_value = (local_148.y - local_168.y) * fVar14;
  local_188 = 0;
  VStack_180.y = base_value;
  VStack_180.x = fVar17;
  local_118 = VVar3.x;
  fStack_114 = VVar3.y;
  local_108 = render_box.fill_size.x;
  fStack_104 = render_box.fill_size.y;
  fVar18 = local_108 - (local_118 - local_158.x) * fVar14;
  fVar19 = fStack_104 - (fStack_114 - local_158.y) * fVar14;
  local_178.y = fVar19;
  local_178.x = fVar18;
  fStack_170 = local_108;
  fStack_16c = fStack_104;
  paVar6 = (this->edges)._M_t.
           super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>._M_head_impl;
  if (paVar6 != (array<Rml::NumericValue,_4UL> *)0x0) {
    local_148.y = base_value;
    local_148.x = fVar17;
    uStack_140 = CONCAT44((uStack_140._4_4_ - uStack_160._4_4_) * fVar14,
                          ((float)uStack_140 - (float)uStack_160) * fVar14);
    local_158.x = fVar18;
    local_158.y = fVar19;
    uStack_150._0_4_ = 0.0 - (0.0 - (float)uStack_150) * fVar14;
    uStack_150._4_4_ = 0.0 - (0.0 - uStack_150._4_4_) * fVar14;
    base_value = Element::ResolveNumericValue(element,paVar6->_M_elems[0],base_value);
    local_168.x = local_108 - local_158.x;
    local_168.y = fStack_104 - local_158.y;
    uStack_160 = CONCAT44(0.0 - uStack_150._4_4_,0.0 - (float)uStack_150);
    local_158.x = Element::ResolveNumericValue
                            (element,((this->edges)._M_t.
                                      super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                     ._M_head_impl)->_M_elems[1],local_168.x);
    local_158.y = extraout_XMM0_Db;
    uStack_150 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    local_168.x = Element::ResolveNumericValue
                            (element,((this->edges)._M_t.
                                      super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                      .
                                      super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                     ._M_head_impl)->_M_elems[2],local_168.y);
    local_168.y = extraout_XMM0_Db_00;
    uStack_160 = CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
    fVar17 = Element::ResolveNumericValue
                       (element,((this->edges)._M_t.
                                 super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                 .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                ._M_head_impl)->_M_elems[3],local_148.x);
    fVar18 = local_108 - local_158.x;
    fVar19 = fStack_104 - local_168.x;
    local_178.y = fVar19;
    local_178.x = fVar18;
    VStack_180.y = base_value;
    VStack_180.x = fVar17;
  }
  surface_center_size.y = fVar19 - base_value;
  surface_center_size.x = fVar18 - fVar17;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 4) {
    pfVar1 = (float *)((long)&surface_center_size.x + lVar13);
    if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
      fVar14 = *(float *)((long)&tex_pos[1].x + lVar13) - *(float *)((long)&tex_pos[0].x + lVar13);
      fVar14 = (fVar14 / ((*(float *)((long)&tex_pos[3].x + lVar13) -
                          *(float *)((long)&tex_pos[2].x + lVar13)) + fVar14)) *
               *(float *)((long)&surface_dimensions.x + lVar13);
      *(float *)((long)&VStack_180.x + lVar13) = fVar14;
      *(float *)((long)&local_178.x + lVar13) = fVar14;
    }
  }
  for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 8) {
    *(ulong *)((long)&local_188 + lVar13) =
         CONCAT44((float)((ulong)*(undefined8 *)((long)&local_188 + lVar13) >> 0x20) +
                  render_box.border_widths._M_elems[0],
                  (float)*(undefined8 *)((long)&local_188 + lVar13) +
                  render_box.border_widths._M_elems[3]);
  }
  VStack_180 = Vector2<float>::Round(&VStack_180);
  local_178 = Vector2<float>::Round(&local_178);
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar13 = 0x10;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize(&mesh.vertices,0x10);
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    fVar14 = tex_coords[lVar9].y;
    lVar11 = lVar13;
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      *(Colour<unsigned_char,_255,_true> *)
       ((long)mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11 + -8) = CVar7;
      uVar4 = *(undefined4 *)((long)&local_188 + lVar9 * 8 + 4);
      *(undefined4 *)
       ((long)mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11 + -0x10) =
           *(undefined4 *)(&local_188 + lVar12);
      *(undefined4 *)
       ((long)mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11 + -0xc) = uVar4;
      *(float *)((long)mesh.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar11 + -4) =
           tex_coords[lVar12].x;
      *(float *)((long)&((mesh.vertices.
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                          super__Vector_impl_data._M_start)->position).x + lVar11) = fVar14;
      lVar11 = lVar11 + 0x14;
    }
    lVar13 = lVar13 + 0x50;
  }
  ::std::vector<int,_std::allocator<int>_>::resize(&mesh.indices,0x36);
  piVar10 = mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar13 = 0; lVar13 != 0x24; lVar13 = lVar13 + 4) {
    iVar5 = *(int *)((long)&DAT_0031e670 + lVar13);
    *piVar10 = iVar5;
    piVar10[1] = iVar5 + 4;
    piVar10[2] = iVar5 + 1;
    piVar10[3] = iVar5 + 1;
    piVar10[4] = iVar5 + 4;
    piVar10[5] = iVar5 + 5;
    piVar10 = piVar10 + 6;
  }
  this_00 = (RenderManager *)operator_new(0x10);
  mesh_00 = Element::GetRenderManager(element);
  RenderManager::MakeGeometry(this_00,(Mesh *)mesh_00);
  Mesh::~Mesh(&mesh);
  return (DecoratorDataHandle)this_00;
}

Assistant:

DecoratorDataHandle DecoratorNinePatch::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const auto& computed = element->GetComputedValues();

	Texture texture = GetTexture();
	const Vector2f texture_dimensions(texture.GetDimensions());

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f surface_offset = render_box.GetFillOffset();
	const Vector2f surface_dimensions = render_box.GetFillSize();

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	/* In the following, we operate on the four diagonal vertices in the grid, as they define the whole grid. */

	// Absolute texture coordinates 'px'
	Vector2f tex_pos[4] = {
		rect_outer.TopLeft(),
		rect_inner.TopLeft(),
		rect_inner.BottomRight(),
		rect_outer.BottomRight(),
	};

	// Normalized texture coordinates [0, 1]
	Vector2f tex_coords[4];
	for (int i = 0; i < 4; i++)
		tex_coords[i] = tex_pos[i] / texture_dimensions;

	// Natural size is determined from the raw pixel size multiplied by the dp-ratio and the sprite's
	// display scale (determined by eg. the inverse of spritesheet's 'src-scale').
	const float scale_raw_to_natural_dimensions = ElementUtilities::GetDensityIndependentPixelRatio(element) * display_scale;

	// Surface position in pixels [0, surface_dimensions]
	// Need to keep the corner patches at their natural size, but stretch the inner patches.
	Vector2f surface_pos[4];
	surface_pos[0] = {0, 0};
	surface_pos[1] = (tex_pos[1] - tex_pos[0]) * scale_raw_to_natural_dimensions;
	surface_pos[2] = surface_dimensions - (tex_pos[3] - tex_pos[2]) * scale_raw_to_natural_dimensions;
	surface_pos[3] = surface_dimensions;

	// Change the size of the edges if specified.
	if (edges)
	{
		float lengths[4]; // top, right, bottom, left
		lengths[0] = element->ResolveNumericValue((*edges)[0], (surface_pos[1].y - surface_pos[0].y));
		lengths[1] = element->ResolveNumericValue((*edges)[1], (surface_pos[3].x - surface_pos[2].x));
		lengths[2] = element->ResolveNumericValue((*edges)[2], (surface_pos[3].y - surface_pos[2].y));
		lengths[3] = element->ResolveNumericValue((*edges)[3], (surface_pos[1].x - surface_pos[0].x));

		surface_pos[1].y = lengths[0];
		surface_pos[2].x = surface_dimensions.x - lengths[1];
		surface_pos[2].y = surface_dimensions.y - lengths[2];
		surface_pos[1].x = lengths[3];
	}

	// In case the surface dimensions are less than the size of the corners, we need to scale down the corner rectangles, one dimension at a time.
	const Vector2f surface_center_size = surface_pos[2] - surface_pos[1];
	for (int i = 0; i < 2; i++)
	{
		if (surface_center_size[i] < 0.0f)
		{
			float top_left_size = tex_pos[1][i] - tex_pos[0][i];
			float bottom_right_size = tex_pos[3][i] - tex_pos[2][i];
			surface_pos[1][i] = top_left_size / (top_left_size + bottom_right_size) * surface_dimensions[i];
			surface_pos[2][i] = surface_pos[1][i];
		}
	}

	// Now offset all positions, relative to the border box.
	for (Vector2f& surface_pos_entry : surface_pos)
		surface_pos_entry += surface_offset;

	// Round the inner corners
	surface_pos[1] = surface_pos[1].Round();
	surface_pos[2] = surface_pos[2].Round();

	/* Now we have all the coordinates we need. Expand the diagonal vertices to the 16 individual vertices. */
	Mesh mesh;
	Vector<Vertex>& vertices = mesh.vertices;
	Vector<int>& indices = mesh.indices;

	vertices.resize(4 * 4);

	for (int y = 0; y < 4; y++)
	{
		for (int x = 0; x < 4; x++)
		{
			Vertex& vertex = vertices[y * 4 + x];
			vertex.colour = quad_colour;
			vertex.position = {surface_pos[x].x, surface_pos[y].y};
			vertex.tex_coord = {tex_coords[x].x, tex_coords[y].y};
		}
	}

	// Nine rectangles, two triangles per rectangle, three indices per triangle.
	indices.resize(9 * 2 * 3);

	// Fill in the indices one rectangle at a time.
	const int top_left_indices[9] = {0, 1, 2, 4, 5, 6, 8, 9, 10};
	for (int rectangle = 0; rectangle < 9; rectangle++)
	{
		int i = rectangle * 6;
		int top_left_index = top_left_indices[rectangle];
		indices[i] = top_left_index;
		indices[i + 1] = top_left_index + 4;
		indices[i + 2] = top_left_index + 1;
		indices[i + 3] = top_left_index + 1;
		indices[i + 4] = top_left_index + 4;
		indices[i + 5] = top_left_index + 5;
	}

	Geometry* data = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(data);
}